

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateNucleus(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *eps,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *threshold)

{
  Pring *pPVar1;
  int *piVar2;
  uint *puVar3;
  int iVar4;
  int p_col;
  int iVar5;
  pointer pnVar6;
  Pring *pPVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (this->stat != SINGULAR) {
    (this->temp).pivots.mkwtz = -1;
    (this->temp).pivots.idx = -1;
    (this->temp).pivots.pos = -1;
    pPVar1 = &(this->temp).pivots;
    do {
      iVar4 = (this->temp).stage;
      if (this->thedim + -1 <= iVar4) {
        if (this->thedim <= iVar4) {
          return;
        }
        iVar4 = ((this->temp).pivot_rowNZ[1].next)->idx;
        p_col = ((this->temp).pivot_colNZ[1].next)->idx;
        (this->u).row.len[iVar4] = 0;
        piVar2 = (this->u).col.len + p_col;
        *piVar2 = *piVar2 + -1;
        pnVar6 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar5 = (this->u).row.start[iVar4];
        local_68.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)pnVar6[iVar5].m_backend.data._M_elems + 0x20);
        local_68.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)pnVar6[iVar5].m_backend.data._M_elems;
        local_68.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)pnVar6[iVar5].m_backend.data._M_elems + 8);
        puVar3 = (uint *)((long)pnVar6[iVar5].m_backend.data._M_elems + 0x10);
        local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
        local_68.m_backend.exp = pnVar6[iVar5].m_backend.exp;
        local_68.m_backend.neg = pnVar6[iVar5].m_backend.neg;
        local_68.m_backend.fpclass = pnVar6[iVar5].m_backend.fpclass;
        local_68.m_backend.prec_elem = pnVar6[iVar5].m_backend.prec_elem;
        setPivot(this,(this->temp).stage,p_col,iVar4,&local_68);
        return;
      }
      pPVar7 = (this->temp).pivot_rowNZ;
      if (pPVar7[1].next == pPVar7 + 1) {
        pPVar7 = (this->temp).pivot_colNZ;
        if (pPVar7[1].next == pPVar7 + 1) {
          (this->temp).pivots.next = pPVar1;
          (this->temp).pivots.prev = pPVar1;
          local_a8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((threshold->m_backend).data._M_elems + 8);
          local_a8.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(threshold->m_backend).data._M_elems;
          local_a8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((threshold->m_backend).data._M_elems + 2);
          local_a8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((threshold->m_backend).data._M_elems + 4);
          local_a8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((threshold->m_backend).data._M_elems + 6);
          local_a8.m_backend.exp = (threshold->m_backend).exp;
          local_a8.m_backend.neg = (threshold->m_backend).neg;
          local_a8.m_backend.fpclass = (threshold->m_backend).fpclass;
          local_a8.m_backend.prec_elem = (threshold->m_backend).prec_elem;
          selectPivots(this,&local_a8);
          pPVar7 = pPVar1;
          while (pPVar7 = pPVar7->next, pPVar7 != pPVar1) {
            local_e8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 8);
            local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
            local_e8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 2);
            local_e8.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 4);
            local_e8.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((eps->m_backend).data._M_elems + 6);
            local_e8.m_backend.exp = (eps->m_backend).exp;
            local_e8.m_backend.neg = (eps->m_backend).neg;
            local_e8.m_backend.fpclass = (eps->m_backend).fpclass;
            local_e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
            eliminatePivot(this,pPVar7->idx,pPVar7->pos,&local_e8);
          }
        }
        else {
          eliminateColSingletons(this);
        }
      }
      else {
        eliminateRowSingletons(this);
      }
      pPVar7 = (this->temp).pivot_rowNZ;
    } while ((pPVar7->next == pPVar7) && (pPVar7 = (this->temp).pivot_colNZ, pPVar7->next == pPVar7)
            );
    this->stat = SINGULAR;
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminateNucleus(const R eps,
                                    const R threshold)
{
   int r, c;
   CLUFactor<R>::Pring* pivot;

   if(this->stat == SLinSolver<R>::SINGULAR)
      return;

   temp.pivots.mkwtz = -1;

   temp.pivots.idx = -1;

   temp.pivots.pos = -1;

   while(temp.stage < thedim - 1)
   {
#ifndef NDEBUG
      int i;
      // CLUFactorIsConsistent(fac);

      for(i = 0; i < thedim; ++i)
         if(col.perm[i] < 0)
            assert(temp.s_mark[i] == 0);

#endif

      if(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]))
         /* row singleton available */
         eliminateRowSingletons();
      else if(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]))
         /* column singleton available */
         eliminateColSingletons();
      else
      {
         initDR(temp.pivots);
         selectPivots(threshold);

         assert(temp.pivots.next != &temp.pivots &&
                "ERROR: no pivot element selected");

         for(pivot = temp.pivots.next; pivot != &temp.pivots;
               pivot = pivot->next)
         {
            eliminatePivot(pivot->idx, pivot->pos, eps);
         }
      }

      if(temp.pivot_rowNZ->next != temp.pivot_rowNZ ||
            temp.pivot_colNZ->next != temp.pivot_colNZ)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   if(temp.stage < thedim)
   {
      /*      Eliminate remaining element.
       *      Note, that this must be both, column and row singleton.
       */
      assert(temp.pivot_rowNZ[1].next != &(temp.pivot_rowNZ[1]) &&
             "ERROR: one row must be left");
      assert(temp.pivot_colNZ[1].next != &(temp.pivot_colNZ[1]) &&
             "ERROR: one col must be left");
      r = temp.pivot_rowNZ[1].next->idx;
      c = temp.pivot_colNZ[1].next->idx;
      u.row.len[r] = 0;
      u.col.len[c]--;
      setPivot(temp.stage, c, r, u.row.val[u.row.start[r]]);
   }
}